

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
dlib::
add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>
::add_layer(add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>
            *this)

{
  bool bVar1;
  pointer this_00;
  long in_RDI;
  resizable_tensor *this_01;
  pointer in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  resizable_tensor *in_stack_ffffffffffffffb0;
  affine_ *in_stack_ffffffffffffffc0;
  add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>
  *in_stack_fffffffffffffff0;
  
  affine_::affine_(in_stack_ffffffffffffffc0);
  operator_new(0x3f0);
  add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>
  ::add_layer(in_stack_fffffffffffffff0);
  std::
  unique_ptr<dlib::add_layer<dlib::con_<512l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,std::default_delete<dlib::add_layer<dlib::con_<512l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>>>
  ::
  unique_ptr<std::default_delete<dlib::add_layer<dlib::con_<512l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>>,void>
            ((unique_ptr<dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>_>_>
              *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  *(undefined1 *)(in_RDI + 0x1d0) = 0;
  *(undefined1 *)(in_RDI + 0x1d1) = 1;
  *(undefined1 *)(in_RDI + 0x1d2) = 0;
  resizable_tensor::resizable_tensor(in_stack_ffffffffffffffb0);
  resizable_tensor::resizable_tensor(in_stack_ffffffffffffffb0);
  this_01 = (resizable_tensor *)(in_RDI + 0x308);
  resizable_tensor::resizable_tensor(this_01);
  resizable_tensor::resizable_tensor(this_01);
  bVar1 = this_layer_operates_inplace
                    ((add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>
                      *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  if (bVar1) {
    this_00 = std::
              unique_ptr<dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>_>_>
              ::operator->((unique_ptr<dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>_>_>
                            *)0x1254af);
    add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>
    ::disable_output_and_gradient_getters(this_00);
  }
  return;
}

Assistant:

add_layer(
        ):
            subnetwork(new subnet_type()),
            this_layer_setup_called(false),
            gradient_input_is_stale(true),
            get_output_and_gradient_input_disabled(false)
        {
            if (this_layer_operates_inplace())
                subnetwork->disable_output_and_gradient_getters();
        }